

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

string * __thiscall
EOPlus::Parser::ParseQuestName_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  int line_;
  Parser_Error *this_00;
  pointer pPVar2;
  Token *t_00;
  Token local_190;
  string local_140;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  variant local_a8;
  undefined1 local_68 [8];
  Token t;
  Parser *this_local;
  
  t._72_8_ = this;
  util::variant::variant(&local_a8);
  Token::Token((Token *)local_68,Invalid,&local_a8);
  util::variant::~variant(&local_a8);
  bVar1 = GetToken(this,(Token *)local_68,2);
  if (!bVar1) {
    this_00 = (Parser_Error *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Expected string after \'questname\'.",&local_119);
    std::operator+(&local_f8,&local_118," Got: ");
    pPVar2 = std::
             unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ::operator->(&this->tok);
    Parser_Token_Server_Base::RejectToken(&local_190,pPVar2);
    token_got_string_abi_cxx11_(&local_140,(EOPlus *)&local_190,t_00);
    std::operator+(&local_d8,&local_f8,&local_140);
    pPVar2 = std::
             unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ::operator->(&this->tok);
    line_ = Parser_Token_Server_Base::RejectLine(pPVar2);
    Parser_Error::Parser_Error(this_00,&local_d8,line_);
    __cxa_throw(this_00,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
  }
  util::variant::operator_cast_to_string(__return_storage_ptr__,(variant *)&t);
  Token::~Token((Token *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::ParseQuestName()
	{
		Token t;

		if (this->GetToken(t, Token::String))
			return std::string(t.data);

		PARSER_ERROR_GOT("Expected string after 'questname'.");
	}